

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_one_bcm(APITests *this)

{
  long in_RDI;
  allocator local_61;
  string local_60 [40];
  string *in_stack_ffffffffffffffc8;
  allocator in_stack_ffffffffffffffd7;
  string local_28 [40];
  
  GPIO::setmode(BCM);
  GPIO::getmode();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",(allocator *)&stack0xffffffffffffffd7);
  assert::is_true((bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  GPIO::setup(*(int *)(in_RDI + 0xb8),IN,-1);
  GPIO::cleanup();
  GPIO::getmode();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  assert::is_true((bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void test_setup_one_bcm()
    {
        GPIO::setmode(GPIO::BCM);
        assert::is_true(GPIO::getmode() == GPIO::BCM);
        GPIO::setup(bcm_pin, GPIO::IN);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }